

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjIsEmpty(jx9_value *pObj)

{
  char *pcVar1;
  jx9_hashmap *pMap;
  char *zEnd;
  char *zIn;
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 0x20U) == 0) {
    if ((pObj->iFlags & 2U) == 0) {
      if ((pObj->iFlags & 4U) == 0) {
        if ((pObj->iFlags & 8U) == 0) {
          if ((pObj->iFlags & 1U) == 0) {
            if ((pObj->iFlags & 0x40U) == 0) {
              if ((pObj->iFlags & 0x100U) == 0) {
                pObj_local._4_4_ = 1;
              }
              else {
                pObj_local._4_4_ = 0;
              }
            }
            else {
              pObj_local._4_4_ = (uint)(*(int *)((pObj->x).iVal + 0x2c) == 0);
            }
          }
          else if ((pObj->sBlob).nByte == 0) {
            pObj_local._4_4_ = 1;
          }
          else {
            zEnd = (char *)(pObj->sBlob).pBlob;
            pcVar1 = zEnd + (pObj->sBlob).nByte;
            for (; (zEnd < pcVar1 && (*zEnd == '0')); zEnd = zEnd + 1) {
            }
            pObj_local._4_4_ = (uint)(pcVar1 <= zEnd);
          }
        }
        else {
          pObj_local._4_4_ = (uint)(((pObj->x).iVal != 0 ^ 0xffU) & 1);
        }
      }
      else {
        pObj_local._4_4_ = (uint)((pObj->x).rVal == 0.0);
      }
    }
    else {
      pObj_local._4_4_ = (uint)((pObj->x).iVal == 0);
    }
  }
  else {
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjIsEmpty(jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_NULL ){
		return TRUE;
	}else if( pObj->iFlags & MEMOBJ_INT ){
		return pObj->x.iVal == 0 ? TRUE : FALSE;
	}else if( pObj->iFlags & MEMOBJ_REAL ){
		return pObj->x.rVal == (jx9_real)0 ? TRUE : FALSE;
	}else if( pObj->iFlags & MEMOBJ_BOOL ){
		return !pObj->x.iVal;
	}else if( pObj->iFlags & MEMOBJ_STRING ){
		if( SyBlobLength(&pObj->sBlob) <= 0 ){
			return TRUE;
		}else{
			const char *zIn, *zEnd;
			zIn = (const char *)SyBlobData(&pObj->sBlob);
			zEnd = &zIn[SyBlobLength(&pObj->sBlob)];
			while( zIn < zEnd ){
				if( zIn[0] != '0' ){
					break;
				}
				zIn++;
			}
			return zIn >= zEnd ? TRUE : FALSE;
		}
	}else if( pObj->iFlags & MEMOBJ_HASHMAP ){
		jx9_hashmap *pMap = (jx9_hashmap *)pObj->x.pOther;
		return pMap->nEntry == 0 ? TRUE : FALSE;
	}else if ( pObj->iFlags & (MEMOBJ_RES) ){
		return FALSE;
	}
	/* Assume empty by default */
	return TRUE;
}